

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.c
# Opt level: O3

void dePoolArray_selfTest(void)

{
  void **ppvVar1;
  deBool dVar2;
  deMemPool *pool;
  dePoolArray *pdVar3;
  dePoolArray *arr;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  pool = deMemPool_createRoot((deMemPoolUtil *)0x0,0);
  pdVar3 = (dePoolArray *)deMemPool_alloc(pool,0x20);
  if (pdVar3 != (dePoolArray *)0x0) {
    pdVar3->elementSize = 0;
    pdVar3->numElements = 0;
    pdVar3->capacity = 0;
    pdVar3->pageTableCapacity = 0;
    pdVar3->pageTable = (void **)0x0;
    pdVar3->pool = pool;
    pdVar3->elementSize = 4;
  }
  arr = (dePoolArray *)deMemPool_alloc(pool,0x20);
  if (arr != (dePoolArray *)0x0) {
    arr->elementSize = 0;
    arr->numElements = 0;
    arr->capacity = 0;
    arr->pageTableCapacity = 0;
    arr->pageTable = (void **)0x0;
    arr->pool = pool;
    arr->elementSize = 2;
  }
  iVar5 = 0;
  do {
    deMemPool_alloc(pool,1);
    uVar4 = pdVar3->numElements;
    iVar6 = uVar4 + 1;
    if (pdVar3->capacity < iVar6) {
      dVar2 = dePoolArray_reserve(pdVar3,iVar6);
      if (dVar2 != 0) {
        uVar4 = pdVar3->numElements;
        iVar6 = uVar4 + 1;
        goto LAB_00938ff6;
      }
    }
    else {
LAB_00938ff6:
      pdVar3->numElements = iVar6;
      *(int *)((long)pdVar3->pageTable[(int)uVar4 >> 4] + (ulong)(uVar4 & 0xf) * 4) = iVar5;
    }
    uVar4 = arr->numElements;
    iVar6 = uVar4 + 1;
    if (arr->capacity < iVar6) {
      dVar2 = dePoolArray_reserve(arr,iVar6);
      if (dVar2 != 0) {
        uVar4 = arr->numElements;
        iVar6 = uVar4 + 1;
        goto LAB_00939030;
      }
    }
    else {
LAB_00939030:
      arr->numElements = iVar6;
      *(short *)((long)arr->pageTable[(int)uVar4 >> 4] + (ulong)(uVar4 & 0xf) * 2) = (short)iVar5;
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 5000);
  if (pdVar3->numElements != 5000) {
    deAssertFail("dePoolIntArray_getNumElements(arr) == 5000",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                 ,0xae);
  }
  if (arr->numElements != 5000) {
    deAssertFail("dePoolInt16Array_getNumElements(arr16) == 5000",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                 ,0xaf);
  }
  uVar4 = 0;
  do {
    if (uVar4 != *(uint *)((long)pdVar3->pageTable[uVar4 >> 4] + (ulong)(uVar4 & 0xf) * 4)) {
      deAssertFail("dePoolIntArray_get(arr, i) == i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xb2);
    }
    if (uVar4 != (int)*(short *)((long)arr->pageTable[uVar4 >> 4] + (ulong)(uVar4 & 0xf) * 2)) {
      deAssertFail("dePoolInt16Array_get(arr16, i) == i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xb3);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 5000);
  iVar5 = 4999;
  do {
    uVar4 = pdVar3->numElements - 1;
    pdVar3->numElements = uVar4;
    if (iVar5 != *(int *)((long)pdVar3->pageTable[(int)uVar4 >> 4] + (ulong)(uVar4 & 0xf) * 4)) {
      deAssertFail("dePoolIntArray_popBack(arr) == (4999 - i)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xb9);
    }
    uVar4 = arr->numElements - 1;
    arr->numElements = uVar4;
    if (iVar5 != *(short *)((long)arr->pageTable[(int)uVar4 >> 4] + (ulong)(uVar4 & 0xf) * 2)) {
      deAssertFail("dePoolInt16Array_popBack(arr16) == (4999 - i)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xba);
    }
    iVar5 = iVar5 + -1;
  } while (iVar5 != 3999);
  if (pdVar3->numElements != 4000) {
    deAssertFail("dePoolIntArray_getNumElements(arr) == 4000",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                 ,0xbd);
  }
  if (arr->numElements != 4000) {
    deAssertFail("dePoolInt16Array_getNumElements(arr16) == 4000",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                 ,0xbe);
  }
  uVar4 = 0;
  do {
    if (uVar4 != *(uint *)((long)pdVar3->pageTable[uVar4 >> 4] + (ulong)(uVar4 & 0xf) * 4)) {
      deAssertFail("dePoolIntArray_get(arr, i) == i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xc1);
    }
    if (uVar4 != (int)*(short *)((long)arr->pageTable[uVar4 >> 4] + (ulong)(uVar4 & 0xf) * 2)) {
      deAssertFail("dePoolInt16Array_get(arr16, i) == i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xc2);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 4000);
  if (pdVar3->capacity < 1000) {
    dVar2 = dePoolArray_reserve(pdVar3,1000);
    if (dVar2 != 0) goto LAB_00939253;
  }
  else {
LAB_00939253:
    pdVar3->numElements = 1000;
  }
  if (arr->capacity < 1000) {
    dVar2 = dePoolArray_reserve(arr,1000);
    if (dVar2 != 0) goto LAB_00939276;
  }
  else {
LAB_00939276:
    arr->numElements = 1000;
  }
  iVar5 = 1000;
  do {
    uVar4 = pdVar3->numElements;
    iVar6 = uVar4 + 1;
    if (pdVar3->capacity < iVar6) {
      dVar2 = dePoolArray_reserve(pdVar3,iVar6);
      if (dVar2 != 0) {
        uVar4 = pdVar3->numElements;
        iVar6 = uVar4 + 1;
        goto LAB_009392a3;
      }
    }
    else {
LAB_009392a3:
      pdVar3->numElements = iVar6;
      *(int *)((long)pdVar3->pageTable[(int)uVar4 >> 4] + (ulong)(uVar4 & 0xf) * 4) = iVar5;
    }
    uVar4 = arr->numElements;
    iVar6 = uVar4 + 1;
    if (arr->capacity < iVar6) {
      dVar2 = dePoolArray_reserve(arr,iVar6);
      if (dVar2 != 0) {
        uVar4 = arr->numElements;
        iVar6 = uVar4 + 1;
        goto LAB_009392dd;
      }
    }
    else {
LAB_009392dd:
      arr->numElements = iVar6;
      *(short *)((long)arr->pageTable[(int)uVar4 >> 4] + (ulong)(uVar4 & 0xf) * 2) = (short)iVar5;
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 5000);
  if (pdVar3->numElements != 5000) {
    deAssertFail("dePoolIntArray_getNumElements(arr) == 5000",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                 ,0xce);
  }
  if (arr->numElements != 5000) {
    deAssertFail("dePoolInt16Array_getNumElements(arr16) == 5000",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                 ,0xcf);
  }
  uVar4 = 0;
  do {
    if (uVar4 != *(uint *)((long)pdVar3->pageTable[uVar4 >> 4] + (ulong)(uVar4 & 0xf) * 4)) {
      deAssertFail("dePoolIntArray_get(arr, i) == i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xd2);
    }
    if (uVar4 != (int)*(short *)((long)arr->pageTable[uVar4 >> 4] + (ulong)(uVar4 & 0xf) * 2)) {
      deAssertFail("dePoolInt16Array_get(arr16, i) == i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xd3);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 5000);
  pdVar3 = (dePoolArray *)deMemPool_alloc(pool,0x20);
  if (pdVar3 == (dePoolArray *)0x0) {
    if (_DAT_00000010 < 0x5dc) goto LAB_009393fb;
  }
  else {
    pdVar3->elementSize = 0;
    pdVar3->numElements = 0;
    pdVar3->capacity = 0;
    pdVar3->pageTableCapacity = 0;
    pdVar3->pageTable = (void **)0x0;
    pdVar3->pool = pool;
    pdVar3->elementSize = 4;
LAB_009393fb:
    dVar2 = dePoolArray_reserve(pdVar3,0x5dc);
    if (dVar2 == 0) goto LAB_00939414;
  }
  pdVar3->numElements = 0x5dc;
LAB_00939414:
  if (pdVar3->capacity < 2000) {
    dePoolArray_reserve(pdVar3,2000);
  }
  ppvVar1 = pdVar3->pageTable;
  uVar4 = 0;
  do {
    *(uint *)((long)ppvVar1[uVar4 >> 4] + (ulong)(uVar4 & 0xf) * 4) = uVar4;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x5dc);
  iVar5 = 0x5dc;
  do {
    uVar4 = pdVar3->numElements;
    iVar6 = uVar4 + 1;
    if (pdVar3->capacity < iVar6) {
      dVar2 = dePoolArray_reserve(pdVar3,iVar6);
      if (dVar2 != 0) {
        uVar4 = pdVar3->numElements;
        iVar6 = uVar4 + 1;
        goto LAB_0093946f;
      }
    }
    else {
LAB_0093946f:
      pdVar3->numElements = iVar6;
      *(int *)((long)pdVar3->pageTable[(int)uVar4 >> 4] + (ulong)(uVar4 & 0xf) * 4) = iVar5;
    }
    iVar5 = iVar5 + 1;
    if (iVar5 == 5000) {
      if (pdVar3->numElements != 5000) {
        deAssertFail("dePoolIntArray_getNumElements(arr) == 5000",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                     ,0xdf);
      }
      uVar4 = 0;
      do {
        if (uVar4 != *(uint *)((long)pdVar3->pageTable[uVar4 >> 4] + (ulong)(uVar4 & 0xf) * 4)) {
          deAssertFail("val == i",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                       ,0xe3);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != 5000);
      deMemPool_destroy(pool);
      return;
    }
  } while( true );
}

Assistant:

void dePoolArray_selfTest (void)
{
	deMemPool*			pool	= deMemPool_createRoot(DE_NULL, 0);
	dePoolIntArray*		arr		= dePoolIntArray_create(pool);
	dePoolInt16Array*	arr16	= dePoolInt16Array_create(pool);
	int					i;

	/* Test pushBack(). */
	for (i = 0; i < 5000; i++)
	{
		/* Dummy alloc to try to break alignments. */
		deMemPool_alloc(pool, 1);

		dePoolIntArray_pushBack(arr, i);
		dePoolInt16Array_pushBack(arr16, (deInt16)i);
	}

	DE_TEST_ASSERT(dePoolIntArray_getNumElements(arr) == 5000);
	DE_TEST_ASSERT(dePoolInt16Array_getNumElements(arr16) == 5000);
	for (i = 0; i < 5000; i++)
	{
		DE_TEST_ASSERT(dePoolIntArray_get(arr, i) == i);
		DE_TEST_ASSERT(dePoolInt16Array_get(arr16, i) == i);
	}

	/* Test popBack(). */
	for (i = 0; i < 1000; i++)
	{
		DE_TEST_ASSERT(dePoolIntArray_popBack(arr) == (4999 - i));
		DE_TEST_ASSERT(dePoolInt16Array_popBack(arr16) == (4999 - i));
	}

	DE_TEST_ASSERT(dePoolIntArray_getNumElements(arr) == 4000);
	DE_TEST_ASSERT(dePoolInt16Array_getNumElements(arr16) == 4000);
	for (i = 0; i < 4000; i++)
	{
		DE_TEST_ASSERT(dePoolIntArray_get(arr, i) == i);
		DE_TEST_ASSERT(dePoolInt16Array_get(arr16, i) == i);
	}

	/* Test setSize(). */
	dePoolIntArray_setSize(arr, 1000);
	dePoolInt16Array_setSize(arr16, 1000);
	for (i = 1000; i < 5000; i++)
	{
		dePoolIntArray_pushBack(arr, i);
		dePoolInt16Array_pushBack(arr16, (deInt16)i);
	}

	DE_TEST_ASSERT(dePoolIntArray_getNumElements(arr) == 5000);
	DE_TEST_ASSERT(dePoolInt16Array_getNumElements(arr16) == 5000);
	for (i = 0; i < 5000; i++)
	{
		DE_TEST_ASSERT(dePoolIntArray_get(arr, i) == i);
		DE_TEST_ASSERT(dePoolInt16Array_get(arr16, i) == i);
	}

	/* Test set() and pushBack() with reserve(). */
	arr = dePoolIntArray_create(pool);
	dePoolIntArray_setSize(arr, 1500);
	dePoolIntArray_reserve(arr, 2000);
	for (i = 0; i < 1500; i++)
		dePoolIntArray_set(arr, i, i);
	for (; i < 5000; i++)
		dePoolIntArray_pushBack(arr, i);

	DE_TEST_ASSERT(dePoolIntArray_getNumElements(arr) == 5000);
	for (i = 0; i < 5000; i++)
	{
		int val = dePoolIntArray_get(arr, i);
		DE_TEST_ASSERT(val == i);
	}

	deMemPool_destroy(pool);
}